

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O2

void __thiscall
PyServerDMLSession::on_invalid_message(PyServerDMLSession *this,InvalidDMLMessageErrorCode error)

{
  function overload;
  object o;
  gil_scoped_acquire gil;
  object local_30;
  InvalidDMLMessageErrorCode local_24;
  object local_20;
  gil_scoped_acquire local_18;
  
  local_24 = error;
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_18);
  pybind11::get_overload<ki::protocol::net::ServerDMLSession>
            ((pybind11 *)&local_30,&this->super_ServerDMLSession,"on_invalid_message");
  if (local_30.super_handle.m_ptr != (PyObject *)0x0) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_20,(InvalidDMLMessageErrorCode *)&local_30);
    pybind11::object::~object(&local_20);
  }
  pybind11::object::~object(&local_30);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_18);
  return;
}

Assistant:

void on_invalid_message(ki::protocol::net::InvalidDMLMessageErrorCode error) override
    {
        PYBIND11_OVERLOAD(
            void, ki::protocol::net::ServerDMLSession,
            on_invalid_message, error);
    }